

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

string * units::detail::testing::testCleanUpString
                   (string *__return_storage_ptr__,string *testString,uint32_t commodity)

{
  string local_40;
  uint32_t local_1c;
  string *psStack_18;
  uint32_t commodity_local;
  string *testString_local;
  
  local_1c = commodity;
  psStack_18 = testString;
  testString_local = __return_storage_ptr__;
  std::__cxx11::string::string((string *)&local_40,(string *)testString);
  clean_unit_string(__return_storage_ptr__,&local_40,local_1c);
  std::__cxx11::string::~string((string *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

std::string
            testCleanUpString(std::string testString, std::uint32_t commodity)
        {
            return clean_unit_string(std::move(testString), commodity);
        }